

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void __thiscall
duckdb::ArgMinMaxBase<duckdb::LessThan,true>::
Execute<duckdb::timestamp_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::timestamp_t,duckdb::string_t>>
          (ArgMinMaxBase<duckdb::LessThan,true> *this,
          ArgMinMaxState<duckdb::timestamp_t,_duckdb::string_t> *state,timestamp_t x_data,
          string_t y_data,AggregateBinaryInput *binary)

{
  bool bVar1;
  char *pcVar2;
  string_t new_value;
  anon_union_16_2_67f50693_for_value local_30;
  
  pcVar2 = y_data.value._0_8_;
  local_30._0_8_ = x_data.value;
  local_30.pointer.ptr = pcVar2;
  bVar1 = string_t::StringComparisonOperators::GreaterThan
                    ((string_t *)(this + 0x10),(string_t *)&local_30.pointer);
  if (bVar1) {
    TemplatedValidityMask<unsigned_long>::RowIsValid
              (*(TemplatedValidityMask<unsigned_long> **)(y_data.value._8_8_ + 8),
               *(idx_t *)(y_data.value._8_8_ + 0x18));
    *(ArgMinMaxState<duckdb::timestamp_t,_duckdb::string_t> **)(this + 8) = state;
    new_value.value.pointer.ptr = pcVar2;
    new_value.value._0_8_ = local_30.pointer.ptr;
    ArgMinMaxStateBase::AssignValue<duckdb::string_t>
              ((ArgMinMaxStateBase *)(this + 0x10),(string_t *)local_30._0_8_,new_value);
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}